

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossibleTransSet(TokenKind kind)

{
  bool bVar1;
  
  if (((ushort)(kind - 0xf) < 0x2a) &&
     ((0x20000000205U >> ((ulong)(kind - 0xf & 0xffff) & 0x3f) & 1) != 0)) {
    return true;
  }
  bVar1 = isPossibleExpression(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossibleTransSet(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::Comma:
        case TokenKind::EqualsArrow:
        case TokenKind::OpenBracket:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}